

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

BEGIN_HANDLE begin_clone(BEGIN_HANDLE value)

{
  AMQP_VALUE pAVar1;
  BEGIN_HANDLE local_18;
  BEGIN_INSTANCE *begin_instance;
  BEGIN_HANDLE value_local;
  
  local_18 = (BEGIN_HANDLE)malloc(8);
  if (local_18 != (BEGIN_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (BEGIN_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

BEGIN_HANDLE begin_clone(BEGIN_HANDLE value)
{
    BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)malloc(sizeof(BEGIN_INSTANCE));
    if (begin_instance != NULL)
    {
        begin_instance->composite_value = amqpvalue_clone(((BEGIN_INSTANCE*)value)->composite_value);
        if (begin_instance->composite_value == NULL)
        {
            free(begin_instance);
            begin_instance = NULL;
        }
    }

    return begin_instance;
}